

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcConstVal::set_sstr(CTcConstVal *this,char *val,size_t len)

{
  this->typ_ = TC_CVT_SSTR;
  (this->val_).floatval_.txt_ = val;
  (this->val_).floatval_.len_ = len;
  CTcGenTarg::note_str(G_cg,len);
  return;
}

Assistant:

void CTcConstVal::set_sstr(const char *val, size_t len)
{
    /* store the type */
    typ_ = TC_CVT_SSTR;

    /* store a pointer to the string */
    val_.strval_.strval_ = val;
    val_.strval_.strval_len_ = len;

    /* for image file layout purposes, record the length of this string */
    G_cg->note_str(len);
}